

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_adapter(void)

{
  shared_ptr<adapter::ASocket> asocket;
  allocator local_39;
  string local_38;
  undefined8 *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  std::__cxx11::string::string((string *)&local_38,"adapter",(allocator *)&local_18);
  print_func_begin(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::make_shared<adapter::ASocket>();
  (**(code **)*local_18)();
  std::make_shared<adapter::B2AAdapter>();
  std::__shared_ptr<adapter::ASocket,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<adapter::ASocket,(__gnu_cxx::_Lock_policy)2> *)&local_18,
             (__shared_ptr<adapter::B2AAdapter,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
  (**(code **)*local_18)();
  std::__cxx11::string::string((string *)&local_38,"adapter",&local_39);
  print_func_end(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return;
}

Assistant:

void test_adapter() {
    print_func_begin("adapter");
    std::shared_ptr<adapter::ASocket> asocket =
            std::make_shared<adapter::ASocket>();
    asocket->charge();

    asocket = std::make_shared<adapter::B2AAdapter>();
    asocket->charge();

    print_func_end("adapter");
}